

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rawbin.c
# Opt level: O1

void rawbin_writeexec(GlobalVars *gv,FILE *f,bool singlefile,char header)

{
  ulong uVar1;
  bool bVar2;
  LinkedSection *pLVar3;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  FILE *__stream;
  undefined7 in_register_00000009;
  long bytes;
  ulong bytes_00;
  ulong unaff_R13;
  char header_00;
  LinkedSection *pLVar6;
  LinkedSection *ls;
  
  pLVar6 = (LinkedSection *)(CONCAT71(in_register_00000009,header) & 0xffffffff);
  pLVar3 = get_next_section(gv);
  __stream = (FILE *)f;
  if (pLVar3 != (LinkedSection *)0x0) {
    bVar2 = true;
    header_00 = (char)pLVar6;
    do {
      while (((ls = pLVar3, ls->size != 0 && ((ls->flags & 1) != 0)) && ((ls->ld_flags & 1) == 0)))
      {
        calc_relocs(gv,ls);
        if (gv->output_sections == 0) {
          if (bVar2) {
            if ((FILE *)gv->trace_file != (FILE *)0x0) {
              fprintf((FILE *)gv->trace_file,"Base address = 0x%08lx.\n",ls->copybase);
            }
LAB_00126ac6:
            rawbin_writeheader(gv,(FILE *)__stream,ls,header_00);
          }
          else {
            uVar1 = ls->copybase;
            bytes_00 = uVar1 - unaff_R13;
            if (uVar1 < unaff_R13 || bytes_00 == 0) {
              if (uVar1 < unaff_R13) {
                bVar2 = false;
                error(0x62,fff[gv->dest_format]->tname,ls->name,pLVar6->name);
                goto LAB_00126b22;
              }
            }
            else {
              if ((singlefile == 0) && (0xf < bytes_00)) {
                if (__stream != (FILE *)f) {
                  fclose(__stream);
                }
                sVar4 = strlen(gv->dest_name);
                sVar5 = strlen(ls->name);
                __s = (char *)alloc(sVar4 + sVar5 + 2);
                sprintf(__s,"%s.%s",gv->dest_name,ls->name);
                __stream = fopen(__s,"wb");
                if (__stream == (FILE *)0x0) goto LAB_00126c44;
                free(__s);
                goto LAB_00126ac6;
              }
              fwritegap((FILE *)__stream,bytes_00);
            }
          }
          bVar2 = false;
        }
        else {
          if ((FILE *)gv->trace_file != (FILE *)0x0) {
            fprintf((FILE *)gv->trace_file,"Base address section %s = 0x%08lx.\n",ls->name,
                    ls->copybase);
          }
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          if (gv->osec_base_name == (char *)0x0) {
            __s = ls->name;
          }
          else {
            sVar4 = strlen(gv->osec_base_name);
            sVar5 = strlen(ls->name);
            __s = (char *)alloc(sVar4 + sVar5 + 2);
            sprintf(__s,"%s.%s",gv->osec_base_name,ls->name);
          }
          __stream = fopen(__s,"wb");
          if (__stream == (FILE *)0x0) {
LAB_00126c44:
            __stream = (FILE *)0x0;
            error(0x1d,__s);
            goto LAB_00126c55;
          }
          if (gv->osec_base_name != (char *)0x0) {
            free(__s);
          }
          rawbin_writeheader(gv,(FILE *)__stream,ls,header_00);
        }
LAB_00126b22:
        fwritex((FILE *)__stream,ls->data,ls->filesize);
        bytes = ls->size - ls->filesize;
        if (ls->filesize <= ls->size && bytes != 0) {
          fwritegap((FILE *)__stream,bytes);
        }
        unaff_R13 = ls->size + ls->copybase;
        pLVar3 = get_next_section(gv);
        pLVar6 = ls;
        if (pLVar3 == (LinkedSection *)0x0) goto LAB_00126c55;
      }
      pLVar3 = get_next_section(gv);
    } while (pLVar3 != (LinkedSection *)0x0);
  }
LAB_00126c55:
  if (__stream != (FILE *)f && __stream != (FILE *)0x0) {
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

static void rawbin_writeexec(struct GlobalVars *gv,FILE *f,bool singlefile,
                             char header)
/* creates executable raw-binary files (with absolute addresses) */
{
  FILE *firstfile = f;
  bool firstsec = TRUE;
  unsigned long addr;
  struct LinkedSection *ls,*prevls;
  char *name;

  while (ls = get_next_section(gv)) {
    if (ls->size==0 || !(ls->flags & SF_ALLOC) || (ls->ld_flags & LSF_NOLOAD))
      continue;  /* ignore empty sections */

    /* resolve all relocations */
    calc_relocs(gv,ls);

    if (gv->output_sections) {
      /* make a new file for each output section */
      if (gv->trace_file)
        fprintf(gv->trace_file,"Base address section %s = 0x%08lx.\n",
                ls->name,ls->copybase);
      if (f != NULL)
        fclose(f);
      if (gv->osec_base_name != NULL) {
        /* use a common base name before the section name */
        name = alloc(strlen(gv->osec_base_name)+strlen(ls->name)+2);
        sprintf(name,"%s.%s",gv->osec_base_name,ls->name);
      }
      else
        name = (char *)ls->name;
      if (!(f = fopen(name,"wb"))) {
        error(29,name);
        break;
      }
      if (gv->osec_base_name != NULL)
        free(name);
      rawbin_writeheader(gv,f,ls,header);
    }
    else if (firstsec) {
      if (gv->trace_file)
        fprintf(gv->trace_file,"Base address = 0x%08lx.\n",ls->copybase);
      firstsec = FALSE;
      rawbin_writeheader(gv,f,ls,header);
    }
    else {
      /* handle gaps between this and the previous section */
      if (ls->copybase > addr) {
        if (ls->copybase-addr < MAXGAP || singlefile) {
          fwritegap(f,ls->copybase-addr);
        }
        else {  /* open a new file for this section */
          if (f != firstfile)
            fclose(f);
          name = alloc(strlen(gv->dest_name)+strlen(ls->name)+2);
          sprintf(name,"%s.%s",gv->dest_name,ls->name);
          if (!(f = fopen(name,"wb"))) {
            error(29,name);
            break;
          }
          free(name);
          rawbin_writeheader(gv,f,ls,header);
        }
      }
      else if (ls->copybase < addr)
        error(98,fff[gv->dest_format]->tname,ls->name,prevls->name);
    }

    /* write section contents */
    fwritex(f,ls->data,ls->filesize);
    if (ls->filesize < ls->size)
      fwritegap(f,ls->size - ls->filesize);

    addr = ls->copybase + ls->size;
    prevls = ls;
  }

  if (f!=NULL && f!=firstfile)
    fclose(f);
}